

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O3

uint16_t eia608_row_style_pramble(int row,int chan,eia608_style_t style,int underline)

{
  return (ushort)(underline != 0) + ((ushort)style & 0xf) * 2 |
         (ushort)eia608_parity_table[(ulong)((eia608_reverse_row_map[row & 0xf] & 1U) << 5) + 0x40]
         | (ushort)eia608_parity_table
                   [(eia608_reverse_row_map[row & 0xf] & 0xeU) * 0x80 + (uint)(chan != 0) * 0x800 +
                    0x1000 >> 8] << 8;
}

Assistant:

static inline uint16_t eia608_row_pramble(int row, int chan, int x, int underline)
{
    row = eia608_reverse_row_map[row & 0x0F];
    return eia608_parity(0x1040 | (chan ? 0x0800 : 0x0000) | ((row << 7) & 0x0700) | ((row << 5) & 0x0020)) | ((x << 1) & 0x001E) | (underline ? 0x0001 : 0x0000);
}